

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

void ExampleHostProcessingLoop(void *inputBuffer,void *outputBuffer,void *userData)

{
  unsigned_long framesProcessed_00;
  unsigned_long framesProcessed;
  undefined1 local_40 [4];
  int callbackResult;
  PaStreamCallbackTimeInfo timeInfo;
  PaSkeletonStream *stream;
  void *userData_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  timeInfo.outputBufferDacTime = (PaTime)userData;
  memset(local_40,0,0x18);
  PaUtil_BeginCpuLoadMeasurement
            ((PaUtilCpuLoadMeasurer *)((long)timeInfo.outputBufferDacTime + 0x50));
  PaUtil_BeginBufferProcessing
            ((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),
             (PaStreamCallbackTimeInfo *)local_40,0);
  PaUtil_SetInputFrameCount((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),0);
  PaUtil_SetInterleavedInputChannels
            ((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),0,inputBuffer,0);
  PaUtil_SetOutputFrameCount((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),0)
  ;
  PaUtil_SetInterleavedOutputChannels
            ((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),0,outputBuffer,0);
  framesProcessed._4_4_ = 0;
  framesProcessed_00 =
       PaUtil_EndBufferProcessing
                 ((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),
                  (int *)((long)&framesProcessed + 4));
  PaUtil_EndCpuLoadMeasurement
            ((PaUtilCpuLoadMeasurer *)((long)timeInfo.outputBufferDacTime + 0x50),framesProcessed_00
            );
  if (framesProcessed._4_4_ != 0) {
    if (framesProcessed._4_4_ == 2) {
      if (*(long *)((long)timeInfo.outputBufferDacTime + 0x20) != 0) {
        (**(code **)((long)timeInfo.outputBufferDacTime + 0x20))
                  (*(undefined8 *)((long)timeInfo.outputBufferDacTime + 0x28));
      }
    }
    else if (*(long *)((long)timeInfo.outputBufferDacTime + 0x20) != 0) {
      (**(code **)((long)timeInfo.outputBufferDacTime + 0x20))
                (*(undefined8 *)((long)timeInfo.outputBufferDacTime + 0x28));
    }
  }
  return;
}

Assistant:

static void ExampleHostProcessingLoop( void *inputBuffer, void *outputBuffer, void *userData )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)userData;
    PaStreamCallbackTimeInfo timeInfo = {0,0,0}; /* IMPLEMENT ME */
    int callbackResult;
    unsigned long framesProcessed;
    
    PaUtil_BeginCpuLoadMeasurement( &stream->cpuLoadMeasurer );
    
    /*
        IMPLEMENT ME:
            - generate timing information
            - handle buffer slips
    */

    /*
        If you need to byte swap or shift inputBuffer to convert it into a
        portaudio format, do it here.
    */



    PaUtil_BeginBufferProcessing( &stream->bufferProcessor, &timeInfo, 0 /* IMPLEMENT ME: pass underflow/overflow flags when necessary */ );

    /*
        depending on whether the host buffers are interleaved, non-interleaved
        or a mixture, you will want to call PaUtil_SetInterleaved*Channels(),
        PaUtil_SetNonInterleaved*Channel() or PaUtil_Set*Channel() here.
    */
    
    PaUtil_SetInputFrameCount( &stream->bufferProcessor, 0 /* default to host buffer size */ );
    PaUtil_SetInterleavedInputChannels( &stream->bufferProcessor,
            0, /* first channel of inputBuffer is channel 0 */
            inputBuffer,
            0 ); /* 0 - use inputChannelCount passed to init buffer processor */

    PaUtil_SetOutputFrameCount( &stream->bufferProcessor, 0 /* default to host buffer size */ );
    PaUtil_SetInterleavedOutputChannels( &stream->bufferProcessor,
            0, /* first channel of outputBuffer is channel 0 */
            outputBuffer,
            0 ); /* 0 - use outputChannelCount passed to init buffer processor */

    /* you must pass a valid value of callback result to PaUtil_EndBufferProcessing()
        in general you would pass paContinue for normal operation, and
        paComplete to drain the buffer processor's internal output buffer.
        You can check whether the buffer processor's output buffer is empty
        using PaUtil_IsBufferProcessorOuputEmpty( bufferProcessor )
    */
    callbackResult = paContinue;
    framesProcessed = PaUtil_EndBufferProcessing( &stream->bufferProcessor, &callbackResult );

    
    /*
        If you need to byte swap or shift outputBuffer to convert it to
        host format, do it here.
    */

    PaUtil_EndCpuLoadMeasurement( &stream->cpuLoadMeasurer, framesProcessed );


    if( callbackResult == paContinue )
    {
        /* nothing special to do */
    }
    else if( callbackResult == paAbort )
    {
        /* IMPLEMENT ME - finish playback immediately  */

        /* once finished, call the finished callback */
        if( stream->streamRepresentation.streamFinishedCallback != 0 )
            stream->streamRepresentation.streamFinishedCallback( stream->streamRepresentation.userData );
    }
    else
    {
        /* User callback has asked us to stop with paComplete or other non-zero value */

        /* IMPLEMENT ME - finish playback once currently queued audio has completed  */

        /* once finished, call the finished callback */
        if( stream->streamRepresentation.streamFinishedCallback != 0 )
            stream->streamRepresentation.streamFinishedCallback( stream->streamRepresentation.userData );
    }
}